

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O2

void __thiscall ot::commissioner::coap::OptionValue::OptionValue(OptionValue *this,uint32_t aUint32)

{
  uchar local_19;
  
  (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; aUint32 != 0; aUint32 = aUint32 >> 8) {
    local_19 = (uchar)aUint32;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->mValue,&local_19);
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

explicit OptionValue(uint32_t aUint32)
    {
        // Encoding an unsigned integer without preceding zeros.
        while (aUint32 != 0)
        {
            mValue.push_back(aUint32 & 0xff);
            aUint32 >>= 8;
        }
        std::reverse(mValue.begin(), mValue.end());
    }